

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

_Bool translateOperand(MCInst *mcInst,OperandSpecifier *operand,InternalInstruction *insn)

{
  MCInst *mcInst_00;
  MCInst *in_RDX;
  MCInst *in_RSI;
  OperandSpecifier *in_stack_00000020;
  uint64_t in_stack_00000028;
  MCInst *in_stack_00000030;
  _Bool local_1;
  
  mcInst_00 = (MCInst *)(ulong)((byte)in_RSI->OpcodePub - 1);
  switch(mcInst_00) {
  case (MCInst *)0x0:
    translateRegister(in_RDX,MODRM_REG_AL);
    local_1 = false;
    break;
  case (MCInst *)0x1:
  case (MCInst *)0x2:
  case (MCInst *)0x3:
  case (MCInst *)0x4:
  case (MCInst *)0x5:
  case (MCInst *)0x6:
  case (MCInst *)0x7:
    local_1 = translateRM(in_RSI,(OperandSpecifier *)in_RDX,(InternalInstruction *)mcInst_00);
    break;
  case (MCInst *)0x8:
    translateRegister(in_RDX,MODRM_REG_AL);
    local_1 = false;
    break;
  case (MCInst *)0x9:
    local_1 = translateMaskRegister(mcInst_00,'\0');
    break;
  case (MCInst *)0xa:
  case (MCInst *)0xb:
  case (MCInst *)0xc:
  case (MCInst *)0xd:
  case (MCInst *)0xe:
  case (MCInst *)0xf:
    local_1 = true;
    break;
  case (MCInst *)0x10:
  case (MCInst *)0x11:
  case (MCInst *)0x12:
  case (MCInst *)0x13:
  case (MCInst *)0x19:
  case (MCInst *)0x1a:
    *(byte *)((long)&in_RDX->Operands[0x10].MachineOperandType + 2) =
         *(byte *)((long)&in_RDX->Operands[0x10].MachineOperandType + 2) + 1;
    translateImmediate(in_stack_00000030,in_stack_00000028,in_stack_00000020,
                       (InternalInstruction *)mcInst);
    local_1 = false;
    break;
  case (MCInst *)0x14:
  case (MCInst *)0x15:
  case (MCInst *)0x16:
  case (MCInst *)0x17:
  case (MCInst *)0x1b:
    translateRegister(in_RDX,MODRM_REG_AL);
    local_1 = false;
    break;
  case (MCInst *)0x18:
    translateFPRegister(in_RDX,'\0');
    local_1 = false;
    break;
  case (MCInst *)0x1c:
    local_1 = translateOperand(in_RSI,(OperandSpecifier *)in_RDX,(InternalInstruction *)mcInst_00);
    break;
  case (MCInst *)0x1d:
    local_1 = translateSrcIndex(in_RDX,(InternalInstruction *)mcInst_00);
    break;
  case (MCInst *)0x1e:
    local_1 = translateDstIndex(in_RDX,(InternalInstruction *)mcInst_00);
    break;
  default:
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool translateOperand(MCInst *mcInst, const OperandSpecifier *operand, InternalInstruction *insn)
{
	switch (operand->encoding) {
		case ENCODING_REG:
			translateRegister(mcInst, insn->reg);
			return false;
		case ENCODING_WRITEMASK:
			return translateMaskRegister(mcInst, insn->writemask);
		CASE_ENCODING_RM:
			return translateRM(mcInst, operand, insn);
		case ENCODING_CB:
		case ENCODING_CW:
		case ENCODING_CD:
		case ENCODING_CP:
		case ENCODING_CO:
		case ENCODING_CT:
			//debug("Translation of code offsets isn't supported.");
			return true;
		case ENCODING_IB:
		case ENCODING_IW:
		case ENCODING_ID:
		case ENCODING_IO:
		case ENCODING_Iv:
		case ENCODING_Ia:
			translateImmediate(mcInst, insn->immediates[insn->numImmediatesTranslated++], operand, insn);
			return false;
		case ENCODING_SI:
			return translateSrcIndex(mcInst, insn);
		case ENCODING_DI:
			return translateDstIndex(mcInst, insn);
		case ENCODING_RB:
		case ENCODING_RW:
		case ENCODING_RD:
		case ENCODING_RO:
		case ENCODING_Rv:
			translateRegister(mcInst, insn->opcodeRegister);
			return false;
		case ENCODING_FP:
			translateFPRegister(mcInst, insn->modRM & 7);
			return false;
		case ENCODING_VVVV:
			translateRegister(mcInst, insn->vvvv);
			return false;
		case ENCODING_DUP:
			return translateOperand(mcInst, &insn->operands[operand->type - TYPE_DUP0], insn);
		default:
			//debug("Unhandled operand encoding during translation");
			return true;
	}
}